

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# src_backend_nodes_makefuncs.cpp
# Opt level: O3

PGFuncCall * duckdb_libpgquery::makeFuncCall(PGList *name,PGList *args,int location)

{
  PGFuncCall *pPVar1;
  
  pPVar1 = (PGFuncCall *)newNode(0x48,T_PGFuncCall);
  pPVar1->funcname = name;
  pPVar1->args = args;
  pPVar1->agg_within_group = false;
  pPVar1->agg_star = false;
  pPVar1->agg_distinct = false;
  pPVar1->func_variadic = false;
  pPVar1->over = (PGWindowDef *)0x0;
  pPVar1->agg_order = (PGList *)0x0;
  pPVar1->agg_filter = (PGNode *)0x0;
  pPVar1->location = location;
  return pPVar1;
}

Assistant:

PGFuncCall *makeFuncCall(PGList *name, PGList *args, int location) {
	PGFuncCall *n = makeNode(PGFuncCall);

	n->funcname = name;
	n->args = args;
	n->agg_order = NIL;
	n->agg_filter = NULL;
	n->agg_within_group = false;
	n->agg_star = false;
	n->agg_distinct = false;
	n->func_variadic = false;
	n->over = NULL;
	n->location = location;
	return n;
}